

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::InsertLocalMinimaIntoAEL(Clipper *this,long64 botY)

{
  TEdge *edge;
  HorzJoinRec *pHVar1;
  long lVar2;
  IntPoint pt2a;
  IntPoint pt1b;
  IntPoint pt1a;
  IntPoint pt2b;
  bool bVar3;
  int iVar4;
  long *plVar5;
  TEdge *pTVar6;
  pointer ppHVar7;
  clipperException *this_00;
  ulong uVar8;
  TEdge *pTVar9;
  IntPoint pt;
  IntPoint local_78;
  long local_68;
  TEdge *local_60;
  IntPoint local_58;
  long64 local_40;
  long64 lStack_38;
  
  plVar5 = *(long **)(this->_vptr_Clipper[-3] +
                     (long)&(this->m_PolyOuts).
                            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                     );
  if (plVar5 != (long *)0x0) {
    local_68 = botY;
    do {
      if (*plVar5 != local_68) {
        return;
      }
      pTVar9 = (TEdge *)plVar5[1];
      edge = (TEdge *)plVar5[2];
      InsertEdgeIntoAEL(this,pTVar9);
      InsertScanbeam(this,pTVar9->ytop);
      InsertEdgeIntoAEL(this,edge);
      if ((&this->m_ClipFillType)[pTVar9->polyType == ptSubject] == pftEvenOdd) {
        pTVar9->windDelta = 1;
        iVar4 = 1;
      }
      else {
        iVar4 = -pTVar9->windDelta;
      }
      edge->windDelta = iVar4;
      SetWindingCount(this,pTVar9);
      edge->windCnt = pTVar9->windCnt;
      edge->windCnt2 = pTVar9->windCnt2;
      pTVar6 = edge;
      if (ABS(edge->dx + 1e+40) < 1e-20) {
        if (this->m_SortedEdges == (TEdge *)0x0) {
          this->m_SortedEdges = edge;
          edge->nextInSEL = (TEdge *)0x0;
          edge->prevInSEL = (TEdge *)0x0;
        }
        else {
          edge->nextInSEL = this->m_SortedEdges;
          edge->prevInSEL = (TEdge *)0x0;
          this->m_SortedEdges->prevInSEL = edge;
          this->m_SortedEdges = edge;
        }
        pTVar6 = edge->nextInLML;
      }
      InsertScanbeam(this,pTVar6->ytop);
      bVar3 = IsContributing(this,pTVar9);
      if (bVar3) {
        local_78.X = pTVar9->xcurr;
        local_78.Y = **(long64 **)
                       (this->_vptr_Clipper[-3] +
                       (long)&(this->m_PolyOuts).
                              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                       );
        AddLocalMinPoly(this,pTVar9,edge,&local_78);
      }
      local_60 = pTVar9;
      if (((-1 < edge->outIdx) && (ABS(edge->dx + 1e+40) < 1e-20)) &&
         (ppHVar7 = (this->m_HorizJoins).
                    super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         (this->m_HorizJoins).
         super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>.
         _M_impl.super__Vector_impl_data._M_finish != ppHVar7)) {
        uVar8 = 0;
        do {
          local_78.X = 0;
          local_78.Y = 0;
          local_58.X = 0;
          local_58.Y = 0;
          pHVar1 = ppHVar7[uVar8];
          pTVar9 = pHVar1->edge;
          pt1a.X = pTVar9->xbot;
          pt1a.Y = pTVar9->ybot;
          pt1b.X = pTVar9->xtop;
          pt1b.Y = pTVar9->ytop;
          pt2a.X = edge->xbot;
          pt2a.Y = edge->ybot;
          local_40 = edge->xtop;
          lStack_38 = edge->ytop;
          pt2b.X = edge->xtop;
          pt2b.Y = edge->ytop;
          bVar3 = GetOverlapSegment(pt1a,pt1b,pt2a,pt2b,&local_78,&local_58);
          if (bVar3) {
            AddJoin(this,pTVar9,edge,pHVar1->savedIdx,-1);
          }
          uVar8 = uVar8 + 1;
          ppHVar7 = (this->m_HorizJoins).
                    super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar8 < (ulong)((long)(this->m_HorizJoins).
                                       super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppHVar7 >>
                                3));
      }
      pTVar9 = local_60;
      if (local_60->nextInAEL != edge) {
        if (((-1 < edge->outIdx) && (-1 < edge->prevInAEL->outIdx)) &&
           (bVar3 = SlopesEqual(edge->prevInAEL,edge,
                                (bool)(this->_vptr_Clipper[-3] + 0x10)
                                      [(long)&(this->m_PolyOuts).
                                              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                      ]), bVar3)) {
          AddJoin(this,edge,edge->prevInAEL,-1,-1);
        }
        local_78.X = pTVar9->xcurr;
        local_78.Y = pTVar9->ycurr;
        for (pTVar9 = pTVar9->nextInAEL; pTVar9 != edge; pTVar9 = pTVar9->nextInAEL) {
          if (pTVar9 == (TEdge *)0x0) {
            this_00 = (clipperException *)__cxa_allocate_exception(0x28);
            clipperException::clipperException
                      (this_00,"InsertLocalMinimaIntoAEL: missing rightbound!");
            __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
          }
          IntersectEdges(this,edge,pTVar9,&local_78,ipNone);
        }
      }
      lVar2 = *(long *)(this->_vptr_Clipper[-3] +
                       (long)&(this->m_PolyOuts).
                              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                       );
      if (lVar2 != 0) {
        *(undefined8 *)
         (this->_vptr_Clipper[-3] +
         (long)&(this->m_PolyOuts).
                super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>) =
             *(undefined8 *)(lVar2 + 0x18);
      }
      plVar5 = *(long **)(this->_vptr_Clipper[-3] +
                         (long)&(this->m_PolyOuts).
                                super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                         );
    } while (plVar5 != (long *)0x0);
  }
  return;
}

Assistant:

void Clipper::InsertLocalMinimaIntoAEL( const long64 botY)
{
  while(  m_CurrentLM  && ( m_CurrentLM->Y == botY ) )
  {
    TEdge* lb = m_CurrentLM->leftBound;
    TEdge* rb = m_CurrentLM->rightBound;

    InsertEdgeIntoAEL( lb );
    InsertScanbeam( lb->ytop );
    InsertEdgeIntoAEL( rb );

    if (IsEvenOddFillType(*lb))
    {
      lb->windDelta = 1;
      rb->windDelta = 1;
    }
    else
    {
      rb->windDelta = -lb->windDelta;
    }
    SetWindingCount( *lb );
    rb->windCnt = lb->windCnt;
    rb->windCnt2 = lb->windCnt2;

    if( NEAR_EQUAL(rb->dx, HORIZONTAL) )
    {
      //nb: only rightbounds can have a horizontal bottom edge
      AddEdgeToSEL( rb );
      InsertScanbeam( rb->nextInLML->ytop );
    }
    else
      InsertScanbeam( rb->ytop );

    if( IsContributing(*lb) )
      AddLocalMinPoly( lb, rb, IntPoint(lb->xcurr, m_CurrentLM->Y) );

    //if any output polygons share an edge, they'll need joining later ...
    if (rb->outIdx >= 0)
    {
      if (NEAR_EQUAL(rb->dx, HORIZONTAL))
      {
        for (HorzJoinList::size_type i = 0; i < m_HorizJoins.size(); ++i)
        {
          IntPoint pt, pt2; //returned by GetOverlapSegment() but unused here.
          HorzJoinRec* hj = m_HorizJoins[i];
          //if horizontals rb and hj.edge overlap, flag for joining later ...
          if (GetOverlapSegment(IntPoint(hj->edge->xbot, hj->edge->ybot),
            IntPoint(hj->edge->xtop, hj->edge->ytop),
            IntPoint(rb->xbot, rb->ybot),
            IntPoint(rb->xtop, rb->ytop), pt, pt2))
              AddJoin(hj->edge, rb, hj->savedIdx);
        }
      }
    }

    if( lb->nextInAEL != rb )
    {
      if (rb->outIdx >= 0 && rb->prevInAEL->outIdx >= 0 &&
        SlopesEqual(*rb->prevInAEL, *rb, m_UseFullRange))
          AddJoin(rb, rb->prevInAEL);

      TEdge* e = lb->nextInAEL;
      IntPoint pt = IntPoint(lb->xcurr, lb->ycurr);
      while( e != rb )
      {
        if(!e) throw clipperException("InsertLocalMinimaIntoAEL: missing rightbound!");
        //nb: For calculating winding counts etc, IntersectEdges() assumes
        //that param1 will be to the right of param2 ABOVE the intersection ...
        IntersectEdges( rb , e , pt , ipNone); //order important here
        e = e->nextInAEL;
      }
    }
    PopLocalMinima();
  }
}